

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.h
# Opt level: O3

void __thiscall ShImmediateData::reset(ShImmediateData *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->primary).type = None;
  if ((this->primary).expression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = (this->primary).expression.expression.
              super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->primary).expression.expression.
    super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->primary).expression.expression.
    super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (this->primary).expression.constExpression = true;
  }
  return;
}

Assistant:

void reset()
	{
		primary.type = ShImmediateType::None;
		if (primary.expression.isLoaded())
			primary.expression = Expression();
	}